

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_begin_array
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  pointer plVar1;
  container_t local_30;
  target_t local_2c;
  
  plVar1 = (this->level_stack_).
           super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (plVar1[-1].even_odd_ == 0) {
    if (plVar1[-1].state_ != buffer) goto LAB_001d99b8;
  }
  else {
    if (plVar1[-1].state_ != buffer) {
      local_2c = destination;
      local_30 = array;
      std::
      vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level,std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level>>
      ::
      emplace_back<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::target_t,jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::container_t>
                ((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level,std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level>>
                  *)&this->level_stack_,&local_2c,&local_30);
      (*this->destination_->_vptr_basic_json_visitor[6])(this->destination_,(ulong)tag,context,ec);
      return true;
    }
    if (plVar1[-1].type_ != object) goto LAB_001d99b8;
  }
  if (plVar1[-1].count_ != 0) {
    std::__cxx11::string::push_back((char)this + '8');
  }
LAB_001d99b8:
  local_2c = buffer;
  local_30 = array;
  std::
  vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level,std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level>>
  ::
  emplace_back<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::target_t,jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::container_t>
            ((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level,std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level>>
              *)&this->level_stack_,&local_2c,&local_30);
  std::__cxx11::string::push_back((char)this + '8');
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_array(semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key())
            {
                if (level_stack_.back().target() == target_t::buffer && level_stack_.back().count() > 0)
                {
                    key_buffer_.push_back(',');
                }
                level_stack_.emplace_back(target_t::buffer, container_t::array);
                key_buffer_.push_back('[');
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (level_stack_.back().is_object() && level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        level_stack_.emplace_back(target_t::buffer, container_t::array);
                        key_buffer_.push_back('[');
                        break;
                    default:
                        level_stack_.emplace_back(target_t::destination, container_t::array);
                        destination_->begin_array(tag, context, ec);
                        break;
                }
            }
            JSONCONS_VISITOR_RETURN;
        }